

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_handlers.c
# Opt level: O0

dropt_error
dropt_handle_uint(dropt_context *context,dropt_option *option,dropt_char *optionArgument,void *dest)

{
  int *piVar1;
  ulong uVar2;
  unsigned_long n;
  dropt_char *end;
  uint *out;
  int val;
  dropt_error err;
  void *dest_local;
  dropt_char *optionArgument_local;
  dropt_option *option_local;
  dropt_context *context_local;
  
  out._4_4_ = 0;
  out._0_4_ = 0;
  end = (dropt_char *)dest;
  _val = dest;
  dest_local = optionArgument;
  optionArgument_local = &option->short_name;
  option_local = (dropt_option *)context;
  if (dest == (void *)0x0) {
    dropt_misuse("No handler destination specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_handlers.c"
                 ,0x123);
    out._4_4_ = 2;
  }
  else if ((optionArgument == (dropt_char *)0x0) || (*optionArgument == '\0')) {
    out._4_4_ = 5;
  }
  else if (*optionArgument == '-') {
    out._4_4_ = 6;
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0;
    uVar2 = strtoul((char *)dest_local,(char **)&n,10);
    if ((*(char *)n == '\0') && (dest_local < n)) {
      piVar1 = __errno_location();
      if ((*piVar1 == 0x22) || (0xffffffff < uVar2)) {
        out._4_4_ = 7;
        out._0_4_ = 0xffffffff;
      }
      else {
        piVar1 = __errno_location();
        if (*piVar1 == 0) {
          out._0_4_ = (undefined4)uVar2;
        }
        else {
          out._4_4_ = 1;
        }
      }
    }
    else {
      out._4_4_ = 6;
    }
  }
  if (out._4_4_ == 0) {
    *(undefined4 *)end = out._0_4_;
  }
  return out._4_4_;
}

Assistant:

dropt_error
dropt_handle_uint(dropt_context* context,
                  const dropt_option* option,
                  const dropt_char* optionArgument,
                  void* dest)
{
    dropt_error err = dropt_error_none;
    int val = 0;
    unsigned int* out = dest;

    if (out == NULL)
    {
        DROPT_MISUSE("No handler destination specified.");
        err = dropt_error_bad_configuration;
    }
    else if (   optionArgument == NULL
             || optionArgument[0] == DROPT_TEXT_LITERAL('\0'))
    {
        err = dropt_error_insufficient_arguments;
    }
    else if (optionArgument[0] == DROPT_TEXT_LITERAL('-'))
    {
        err = dropt_error_mismatch;
    }
    else
    {
        dropt_char* end;
        unsigned long n;
        errno = 0;
        n = dropt_strtoul(optionArgument, &end, 10);

        /* Check that we matched at least one digit.
         * (`strtol`/`strtoul` will return 0 if fed a string with no digits.)
         */
        if (*end == DROPT_TEXT_LITERAL('\0') && end > optionArgument)
        {
            if (errno == ERANGE || n > UINT_MAX)
            {
                err = dropt_error_overflow;
                val = UINT_MAX;
            }
            else if (errno == 0)
            {
                val = (unsigned int) n;
            }
            else
            {
                err = dropt_error_unknown;
            }
        }
        else
        {
            err = dropt_error_mismatch;
        }
    }

    if (err == dropt_error_none) { *out = val; }
    return err;
}